

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec_worker.h
# Opt level: O0

void __thiscall chain_of_responsibility::SecWorker::SecWorker(SecWorker *this)

{
  SecWorker *this_local;
  
  IWorker::IWorker(&this->super_IWorker);
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR_HandlerRequest_0019e980;
  std::__cxx11::string::operator=((string *)&(this->super_IWorker).name_,"sec worker");
  return;
}

Assistant:

SecWorker::SecWorker(/* args */) {
    name_ = "sec worker";
}